

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

target_ulong helper_divs_ppc64(CPUPPCState_conflict2 *env,target_ulong arg1,target_ulong arg2)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = (int)arg2;
  if ((iVar2 != 0) && (iVar2 != -1 || (int)arg1 != -0x80000000)) {
    uVar1 = (ulong)(uint)((int)arg1 >> 0x1f) << 0x20 | arg1 & 0xffffffff;
    env->spr[0] = (long)(int)((long)uVar1 % (long)iVar2);
    return (long)(int)((long)uVar1 / (long)iVar2);
  }
  env->spr[0] = 0;
  return 0xffffffff80000000;
}

Assistant:

target_ulong helper_divs(CPUPPCState *env, target_ulong arg1,
                         target_ulong arg2)
{
    if (((int32_t)arg1 == INT32_MIN && (int32_t)arg2 == (int32_t)-1) ||
        (int32_t)arg2 == 0) {
        env->spr[SPR_MQ] = 0;
        return INT32_MIN;
    } else {
        env->spr[SPR_MQ] = (int32_t)arg1 % (int32_t)arg2;
        return (int32_t)arg1 / (int32_t)arg2;
    }
}